

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_flt_ldst(DisasContext_conflict6 *ctx,uint32_t opc,int ft,TCGv_i64 t0)

{
  TCGContext_conflict6 *s;
  TCGTemp *ts;
  uint uVar1;
  
  uVar1 = (opc + 0x3c000000) * 0x10 | opc + 0x3c000000 >> 0x1c;
  if (uVar1 < 4) {
    s = ctx->uc->tcg_ctx;
    switch(uVar1) {
    case 0:
      ts = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
      tcg_gen_qemu_ld_i32_mips64el
                (s,(TCGv_i32)((long)ts - (long)s),t0,(long)ctx->mem_idx,
                 ctx->default_tcg_memop_mask | MO_LESL);
      gen_store_fpr32(ctx,(TCGv_i32)((long)ts - (long)s),ft);
      break;
    case 1:
      ts = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      tcg_gen_qemu_ld_i64_mips64el
                (s,(TCGv_i64)((long)ts - (long)s),t0,(long)ctx->mem_idx,
                 ctx->default_tcg_memop_mask | MO_64);
      gen_store_fpr64(ctx,(TCGv_i64)((long)ts - (long)s),ft);
      break;
    case 2:
      ts = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
      gen_load_fpr32(ctx,(TCGv_i32)((long)ts - (long)s),ft);
      tcg_gen_qemu_st_i32_mips64el
                (s,(TCGv_i32)((long)ts - (long)s),t0,(long)ctx->mem_idx,
                 ctx->default_tcg_memop_mask | MO_32);
      break;
    case 3:
      ts = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      gen_load_fpr64(ctx,(TCGv_i64)((long)ts - (long)s),ft);
      tcg_gen_qemu_st_i64_mips64el
                (s,(TCGv_i64)((long)ts - (long)s),t0,(long)ctx->mem_idx,
                 ctx->default_tcg_memop_mask | MO_64);
    }
    tcg_temp_free_internal_mips64el(s,ts);
    return;
  }
  generate_exception_err(ctx,0x14,0);
  return;
}

Assistant:

static void gen_flt_ldst(DisasContext *ctx, uint32_t opc, int ft,
                         TCGv t0)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    /*
     * Don't do NOP if destination is zero: we must perform the actual
     * memory access.
     */
    switch (opc) {
    case OPC_LWC1:
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_qemu_ld_i32(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TESL |
                                ctx->default_tcg_memop_mask);
            gen_store_fpr32(ctx, fp0, ft);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    case OPC_SWC1:
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            gen_load_fpr32(ctx, fp0, ft);
            tcg_gen_qemu_st_i32(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEUL |
                                ctx->default_tcg_memop_mask);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    case OPC_LDC1:
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_qemu_ld_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ |
                                ctx->default_tcg_memop_mask);
            gen_store_fpr64(ctx, fp0, ft);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    case OPC_SDC1:
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            gen_load_fpr64(ctx, fp0, ft);
            tcg_gen_qemu_st_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ |
                                ctx->default_tcg_memop_mask);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    default:
        MIPS_INVAL("flt_ldst");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}